

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

int lua_compare(lua_State *L,int index1,int index2,int op)

{
  int *piVar1;
  int iVar2;
  TValue *l;
  TValue *r;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x15f,"int lua_compare(lua_State *, int, int, int)");
  }
  l = index2addr(L,index1);
  r = index2addr(L,index2);
  iVar2 = 0;
  if (r != &luaO_nilobject_ && l != &luaO_nilobject_) {
    if (op == 2) {
      iVar2 = luaV_lessequal(L,l,r);
    }
    else if (op == 1) {
      iVar2 = luaV_lessthan(L,l,r);
    }
    else {
      if (op != 0) {
        __assert_fail("(0) && \"invalid option\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x167,"int lua_compare(lua_State *, int, int, int)");
      }
      iVar2 = luaV_equalobj(L,l,r);
    }
  }
  piVar1 = *(int **)&L[-1].hookmask;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x16a,"int lua_compare(lua_State *, int, int, int)");
  }
  return iVar2;
}

Assistant:

LUA_API int lua_compare (lua_State *L, int index1, int index2, int op) {
  StkId o1, o2;
  int i = 0;
  lua_lock(L);  /* may call tag method */
  o1 = index2addr(L, index1);
  o2 = index2addr(L, index2);
  if (isvalid(o1) && isvalid(o2)) {
    switch (op) {
      case LUA_OPEQ: i = luaV_equalobj(L, o1, o2); break;
      case LUA_OPLT: i = luaV_lessthan(L, o1, o2); break;
      case LUA_OPLE: i = luaV_lessequal(L, o1, o2); break;
      default: api_check(L, 0, "invalid option");
    }
  }
  lua_unlock(L);
  return i;
}